

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

bool P_LerpCalculate(AActor *pmo,PredictPos *from,PredictPos *to,PredictPos *result,float scale)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  DVector2 v;
  double local_28;
  double dStack_20;
  
  dVar1 = (from->pos).X;
  dVar2 = (from->pos).Y;
  dVar3 = (from->pos).Z;
  dVar6 = (to->pos).X;
  dVar7 = (to->pos).Y;
  dVar5 = (to->pos).Z;
  dVar4 = (double)scale;
  dVar6 = ((dVar6 - dVar1) * dVar4 + dVar1) - dVar6;
  dVar7 = ((dVar7 - dVar2) * dVar4 + dVar2) - dVar7;
  dVar5 = ((dVar5 - dVar3) * dVar4 + dVar3) - dVar5;
  P_GetOffsetPosition((pmo->__Pos).X,(pmo->__Pos).Y,dVar6,dVar7);
  (result->pos).Z = (pmo->__Pos).Z + dVar5;
  (result->pos).X = local_28;
  (result->pos).Y = dStack_20;
  return scale <= 1.0 &&
         (double)cl_predict_lerpthreshold.Value < dVar5 * dVar5 + dVar7 * dVar7 + dVar6 * dVar6;
}

Assistant:

bool P_LerpCalculate(AActor *pmo, PredictPos from, PredictPos to, PredictPos &result, float scale)
{
	//DVector2 pfrom = Displacements.getOffset(from.portalgroup, to.portalgroup);
	DVector3 vecFrom = from.pos;
	DVector3 vecTo = to.pos;
	DVector3 vecResult;
	vecResult = vecTo - vecFrom;
	vecResult *= scale;
	vecResult = vecResult + vecFrom;
	DVector3 delta = vecResult - vecTo;

	result.pos = pmo->Vec3Offset(vecResult - to.pos);
	//result.portalgroup = P_PointInSector(result.pos.x, result.pos.y)->PortalGroup;

	// As a fail safe, assume extrapolation is the threshold.
	return (delta.LengthSquared() > cl_predict_lerpthreshold && scale <= 1.00f);
}